

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode Curl_pop3_write(connectdata *conn,char *str,size_t nread)

{
  int *piVar1;
  char cVar2;
  Curl_easy *pCVar3;
  char **ppcVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  byte bVar12;
  
  pCVar3 = conn->data;
  CVar6 = CURLE_OK;
  if (nread == 0) {
    sVar11 = 0;
  }
  else {
    sVar10 = 0;
    sVar11 = 0;
    bVar12 = 0;
    do {
      sVar8 = (conn->proto).pop3c.eob;
      cVar2 = str[sVar10];
      if (cVar2 == '\n') {
        if ((sVar8 == 4) || (sVar8 == 1)) {
          sVar8 = sVar8 + 1;
          goto LAB_00135f2f;
        }
LAB_00135ec3:
        sVar9 = 0;
LAB_00135ec5:
        (conn->proto).pop3c.eob = sVar9;
        if (sVar8 != 0) {
LAB_00135ed1:
          sVar9 = (conn->proto).pop3c.strip;
          lVar7 = -sVar8;
          do {
            sVar9 = sVar9 - 1;
            if (sVar9 == 0xffffffffffffffff) {
              CVar5 = Curl_client_write(conn,1,"\r\n.\r\n",-((ulong)bVar12 + lVar7));
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              bVar12 = 0;
              sVar11 = sVar10;
              break;
            }
            *(size_t *)&(conn->proto).imapc.sasl.state = sVar9;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0);
        }
      }
      else if (cVar2 == '.') {
        if (sVar8 != 2) {
          if (sVar8 != 3) goto LAB_00135ec3;
          (conn->proto).ftpc.dirs = (char **)0x0;
          bVar12 = 1;
          goto LAB_00135ed1;
        }
        sVar8 = 3;
LAB_00135f2f:
        (conn->proto).pop3c.eob = sVar8;
      }
      else {
        if (cVar2 != '\r') goto LAB_00135ec3;
        if (sVar8 == 3) {
          sVar8 = 4;
          goto LAB_00135f2f;
        }
        sVar9 = 1;
        if (sVar8 != 0) goto LAB_00135ec5;
        (conn->proto).pop3c.eob = 1;
        if ((sVar10 != 0) &&
           (CVar5 = Curl_client_write(conn,1,str + sVar11,sVar10 - sVar11), sVar11 = sVar10,
           CVar5 != CURLE_OK)) {
          return CVar5;
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != nread);
  }
  ppcVar4 = (conn->proto).ftpc.dirs;
  if (ppcVar4 == (char **)0x0) {
    if (nread - sVar11 != 0) {
      CVar6 = Curl_client_write(conn,1,str + sVar11,nread - sVar11);
      return CVar6;
    }
  }
  else if (ppcVar4 == (char **)0x5) {
    CVar6 = Curl_client_write(conn,1,"\r\n.\r\n",2);
    piVar1 = &(pCVar3->req).keepon;
    *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
    (conn->proto).ftpc.dirs = (char **)0x0;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_pop3_write(struct connectdata *conn, char *str, size_t nread)
{
  /* This code could be made into a special function in the handler struct */
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  struct pop3_conn *pop3c = &conn->proto.pop3c;
  bool strip_dot = FALSE;
  size_t last = 0;
  size_t i;

  /* Search through the buffer looking for the end-of-body marker which is
     5 bytes (0d 0a 2e 0d 0a). Note that a line starting with a dot matches
     the eob so the server will have prefixed it with an extra dot which we
     need to strip out. Additionally the marker could of course be spread out
     over 5 different data chunks. */
  for(i = 0; i < nread; i++) {
    size_t prev = pop3c->eob;

    switch(str[i]) {
    case 0x0d:
      if(pop3c->eob == 0) {
        pop3c->eob++;

        if(i) {
          /* Write out the body part that didn't match */
          result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                                     i - last);

          if(result)
            return result;

          last = i;
        }
      }
      else if(pop3c->eob == 3)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 0 or 3 then restart the
           pattern matching */
        pop3c->eob = 1;
      break;

    case 0x0a:
      if(pop3c->eob == 1 || pop3c->eob == 4)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 1 or 4 then start the
           search again */
        pop3c->eob = 0;
      break;

    case 0x2e:
      if(pop3c->eob == 2)
        pop3c->eob++;
      else if(pop3c->eob == 3) {
        /* We have an extra dot after the CRLF which we need to strip off */
        strip_dot = TRUE;
        pop3c->eob = 0;
      }
      else
        /* If the character match wasn't at position 2 then start the search
           again */
        pop3c->eob = 0;
      break;

    default:
      pop3c->eob = 0;
      break;
    }

    /* Did we have a partial match which has subsequently failed? */
    if(prev && prev >= pop3c->eob) {
      /* Strip can only be non-zero for the very first mismatch after CRLF
         and then both prev and strip are equal and nothing will be output
         below */
      while(prev && pop3c->strip) {
        prev--;
        pop3c->strip--;
      }

      if(prev) {
        /* If the partial match was the CRLF and dot then only write the CRLF
           as the server would have inserted the dot */
        result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                   strip_dot ? prev - 1 : prev);

        if(result)
          return result;

        last = i;
        strip_dot = FALSE;
      }
    }
  }

  if(pop3c->eob == POP3_EOB_LEN) {
    /* We have a full match so the transfer is done, however we must transfer
    the CRLF at the start of the EOB as this is considered to be part of the
    message as per RFC-1939, sect. 3 */
    result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB, 2);

    k->keepon &= ~KEEP_RECV;
    pop3c->eob = 0;

    return result;
  }

  if(pop3c->eob)
    /* While EOB is matching nothing should be output */
    return CURLE_OK;

  if(nread - last) {
    result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                               nread - last);
  }

  return result;
}